

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O0

int Abc_NodeAddClausesTop(sat_solver *pSat,Abc_Obj_t *pNode,Vec_Int_t *vVars)

{
  int iVar1;
  lit lVar2;
  Abc_Obj_t *pAVar3;
  int RetValue;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vVars_local;
  Abc_Obj_t *pNode_local;
  sat_solver *pSat_local;
  
  pAVar3 = Abc_ObjFanin0(pNode);
  iVar1 = Abc_ObjFaninC0(pNode);
  if (iVar1 == 0) {
    vVars->nSize = 0;
    lVar2 = toLit(pAVar3->Id);
    lVar2 = lit_neg(lVar2);
    Vec_IntPush(vVars,lVar2);
    lVar2 = toLit(pNode->Id);
    Vec_IntPush(vVars,lVar2);
    iVar1 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar1 == 0) {
      printf("The CNF is trivially UNSAT.\n");
      return 0;
    }
    vVars->nSize = 0;
    lVar2 = toLit(pAVar3->Id);
    Vec_IntPush(vVars,lVar2);
    lVar2 = toLit(pNode->Id);
    lVar2 = lit_neg(lVar2);
    Vec_IntPush(vVars,lVar2);
    iVar1 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar1 == 0) {
      printf("The CNF is trivially UNSAT.\n");
      return 0;
    }
  }
  else {
    vVars->nSize = 0;
    lVar2 = toLit(pAVar3->Id);
    Vec_IntPush(vVars,lVar2);
    lVar2 = toLit(pNode->Id);
    Vec_IntPush(vVars,lVar2);
    iVar1 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar1 == 0) {
      printf("The CNF is trivially UNSAT.\n");
      return 0;
    }
    vVars->nSize = 0;
    lVar2 = toLit(pAVar3->Id);
    lVar2 = lit_neg(lVar2);
    Vec_IntPush(vVars,lVar2);
    lVar2 = toLit(pNode->Id);
    lVar2 = lit_neg(lVar2);
    Vec_IntPush(vVars,lVar2);
    iVar1 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
    if (iVar1 == 0) {
      printf("The CNF is trivially UNSAT.\n");
      return 0;
    }
  }
  vVars->nSize = 0;
  lVar2 = toLit(pNode->Id);
  Vec_IntPush(vVars,lVar2);
  iVar1 = sat_solver_addclause(pSat,vVars->pArray,vVars->pArray + vVars->nSize);
  if (iVar1 == 0) {
    printf("The CNF is trivially UNSAT.\n");
  }
  pSat_local._4_4_ = (uint)(iVar1 != 0);
  return pSat_local._4_4_;
}

Assistant:

int Abc_NodeAddClausesTop( sat_solver * pSat, Abc_Obj_t * pNode, Vec_Int_t * vVars )
{
    Abc_Obj_t * pFanin;
    int RetValue = 0;

    pFanin = Abc_ObjFanin0(pNode);
    if ( Abc_ObjFaninC0(pNode) )
    {
        vVars->nSize = 0;
        Vec_IntPush( vVars, toLit(pFanin->Id) );
        Vec_IntPush( vVars, toLit(pNode->Id) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }

        vVars->nSize = 0;
        Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }
    else
    {
        vVars->nSize = 0;
        Vec_IntPush( vVars, lit_neg(toLit(pFanin->Id)) );
        Vec_IntPush( vVars, toLit(pNode->Id) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }

        vVars->nSize = 0;
        Vec_IntPush( vVars, toLit(pFanin->Id) );
        Vec_IntPush( vVars, lit_neg(toLit(pNode->Id)) );
        RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
        if ( !RetValue ) 
        {
            printf( "The CNF is trivially UNSAT.\n" );
            return 0;
        }
    }

    vVars->nSize = 0;
    Vec_IntPush( vVars, toLit(pNode->Id) );
    RetValue = sat_solver_addclause( pSat, vVars->pArray, vVars->pArray + vVars->nSize );
    if ( !RetValue ) 
    {
        printf( "The CNF is trivially UNSAT.\n" );
        return 0;
    }
    return 1;
}